

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O0

void __thiscall
vector_bagwell<unsigned_long,_16U>::push_back
          (vector_bagwell<unsigned_long,_16U> *this,unsigned_long *t)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  unsigned_long *t_local;
  vector_bagwell<unsigned_long,_16U> *this_local;
  
  bVar2 = current_block_full(this);
  if (bVar2) {
    sVar3 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                      (&this->_index_block);
    this->_left_in_block = (ulong)(uint)(0x10 << ((byte)sVar3 & 0x1f));
    puVar4 = (unsigned_long *)malloc(this->_left_in_block << 3);
    this->_insertpos = puVar4;
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::push_back
              (&this->_index_block,&this->_insertpos);
  }
  uVar1 = *t;
  puVar4 = this->_insertpos;
  this->_insertpos = puVar4 + 1;
  *puVar4 = uVar1;
  this->_left_in_block = this->_left_in_block - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}